

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O0

Known * __thiscall Nonogram::get_horizontal(Known *__return_storage_ptr__,Nonogram *this,uint y)

{
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_a0;
  Known local_70;
  uint local_1c;
  Nonogram *pNStack_18;
  uint y_local;
  Nonogram *this_local;
  
  local_1c = y;
  pNStack_18 = this;
  this_local = (Nonogram *)__return_storage_ptr__;
  std::
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_true>
            (&local_a0,&this->m_set,&this->m_value);
  get_board_horizontal(&local_70,this,y,&local_a0);
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair(__return_storage_ptr__,&local_70);
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  ~pair(&local_70);
  std::
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::~pair(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_horizontal(unsigned int y) const {
    return move(get_board_horizontal(y, {m_set, m_value}));
}